

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O2

void toml::detail::skip_until_next_table<toml::type_config>
               (location *loc,context<toml::type_config> *ctx)

{
  element_type *peVar1;
  char_type_conflict cVar2;
  sequence local_100;
  location line_begin;
  region local_98;
  
  do {
    peVar1 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if ((ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start) <= loc->location_) {
      return;
    }
    cVar2 = location::current(loc);
    if (cVar2 == '\n') {
      location::advance(loc,1);
      location::location(&line_begin,loc);
      skip_whitespace<toml::type_config>(loc,ctx);
      syntax::std_table(&local_100,&ctx->toml_spec_);
      sequence::scan(&local_98,&local_100,loc);
      peVar1 = local_98.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      region::~region(&local_98);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector(&local_100.others_);
      if (peVar1 != (element_type *)0x0) {
LAB_002e0f91:
        location::operator=(loc,&line_begin);
        location::~location(&line_begin);
        return;
      }
      syntax::array_table(&local_100,&ctx->toml_spec_);
      sequence::scan(&local_98,&local_100,loc);
      peVar1 = local_98.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      region::~region(&local_98);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector(&local_100.others_);
      if (peVar1 != (element_type *)0x0) goto LAB_002e0f91;
      location::~location(&line_begin);
    }
    location::advance(loc,1);
  } while( true );
}

Assistant:

void skip_until_next_table(location& loc, const context<TC>& ctx)
{
    const auto& spec = ctx.toml_spec();
    while( ! loc.eof())
    {
        if(loc.current() == '\n')
        {
            loc.advance();
            const auto line_begin = loc;

            skip_whitespace(loc, ctx);
            if(syntax::std_table(spec).scan(loc).is_ok())
            {
                loc = line_begin;
                return ;
            }
            if(syntax::array_table(spec).scan(loc).is_ok())
            {
                loc = line_begin;
                return ;
            }
        }
        loc.advance();
    }
}